

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O2

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRGraphicsWindowNode>::
~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRGraphicsWindowNode> *this)

{
  VRSpecificItemFactory<MinVR::VRDisplayNode>::~VRSpecificItemFactory
            (&this->super_VRSpecificItemFactory<MinVR::VRDisplayNode>);
  operator_delete(this,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}